

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

TypePointer * __thiscall TypeFactory::getTypePointer(TypeFactory *this,int4 s,Datatype *pt,uint4 ws)

{
  TypePointer *pTVar1;
  Datatype local_58;
  Datatype *local_18;
  uint4 local_10;
  
  for (; pt->metatype == TYPE_ARRAY; pt = (Datatype *)pt[1]._vptr_Datatype) {
  }
  local_58.name._M_dataplus._M_p = (pointer)&local_58.name.field_2;
  local_58.name._M_string_length = 0;
  local_58.name.field_2._M_local_buf[0] = '\0';
  local_58.metatype = TYPE_PTR;
  local_58.id = 0;
  local_58._vptr_Datatype = (_func_int **)&PTR_restoreXml_003f6040;
  local_58.flags = pt->flags & 1;
  local_58.size = s;
  local_18 = pt;
  local_10 = ws;
  pTVar1 = (TypePointer *)findAdd(this,&local_58);
  Datatype::~Datatype(&local_58);
  return pTVar1;
}

Assistant:

TypePointer *TypeFactory::getTypePointer(int4 s,Datatype *pt,uint4 ws)

{				// Create pointer to type -pt-
  if (pt->getMetatype() == TYPE_ARRAY) {
    // Do no allow pointers to array
    do {
      pt = ((TypeArray *)pt)->getBase();
    } while(pt->getMetatype() == TYPE_ARRAY);
  }
  TypePointer tmp(s,pt,ws);
  return (TypePointer *) findAdd(tmp);
}